

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApplicationFolder.cpp
# Opt level: O2

void __thiscall license::locate::ApplicationFolder::~ApplicationFolder(ApplicationFolder *this)

{
  (this->super_LocatorStrategy)._vptr_LocatorStrategy =
       (_func_int **)&PTR_get_strategy_name_abi_cxx11__0056bdb8;
  std::__cxx11::string::~string((string *)&(this->super_LocatorStrategy).m_strategy_name);
  return;
}

Assistant:

ApplicationFolder::~ApplicationFolder() {}